

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionally_enabled_mutex.hpp
# Opt level: O0

void __thiscall
boost::asio::detail::conditionally_enabled_mutex::conditionally_enabled_mutex
          (conditionally_enabled_mutex *this,bool enabled)

{
  byte in_SIL;
  noncopyable *in_RDI;
  posix_mutex *in_stack_00000010;
  
  noncopyable::noncopyable(in_RDI);
  posix_mutex::posix_mutex(in_stack_00000010);
  in_RDI[0x30] = (noncopyable)(in_SIL & 1);
  return;
}

Assistant:

explicit conditionally_enabled_mutex(bool enabled)
    : enabled_(enabled)
  {
  }